

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

string * __thiscall
BasePort::GetHardwareVersionString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,uchar boardId)

{
  uint uVar1;
  unsigned_long hver;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((boardId < 0x10) && (this->HardwareVersion[boardId] != 0)) {
    uVar1 = (uint)this->HardwareVersion[boardId];
    hver = (unsigned_long)
           (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)&hver);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::GetHardwareVersionString(unsigned char boardId) const
{
    std::string hStr;
    if ((boardId < BoardIO::MAX_BOARDS) && HardwareVersion[boardId]) {
        unsigned long hver = bswap_32(HardwareVersion[boardId]);
        hStr.assign(reinterpret_cast<const char *>(&hver), sizeof(unsigned long));
        hStr.resize(4);
    } else {
        hStr = "Invalid";
    }
    return hStr;
}